

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O2

bool __thiscall PrintC::checkPrintNegation(PrintC *this,Varnode *vn)

{
  OpCode OVar1;
  bool reorder;
  undefined8 uStack_8;
  
  if ((~vn->flags & 0x50) == 0) {
    uStack_8 = (ulong)~vn->flags;
    OVar1 = get_booleanflip(vn->def->opcode->opcode,(bool *)((long)&uStack_8 + 7));
    return OVar1 != CPUI_MAX;
  }
  return false;
}

Assistant:

bool isFree(void) const { return ((flags&(Varnode::written|Varnode::input))==0); }